

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::MixedApiCase::createShader(MixedApiCase *this)

{
  RenderContext *renderCtx;
  ShaderProgram *this_00;
  ProgramSources *pPVar1;
  TestError *this_01;
  allocator<char> local_18a;
  allocator<char> local_189;
  string local_188;
  string local_168;
  undefined1 local_148 [40];
  undefined1 local_120 [40];
  ProgramSources local_f8;
  
  this_00 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = ((this->super_BindingRenderCase).super_TestCase.m_context)->m_renderCtx;
  memset(&local_f8,0,0xac);
  local_f8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_f8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_f8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_f8._193_8_ = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_168,
             "#version 310 es\nin highp vec4 a_position;\nin highp vec4 a_color;\nout highp vec4 v_color;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_color = a_color;\n}\n"
             ,&local_189);
  glu::VertexSource::VertexSource((VertexSource *)local_148,&local_168);
  pPVar1 = glu::ProgramSources::operator<<(&local_f8,(ShaderSource *)local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,
             "#version 310 es\nin mediump vec4 v_color;\nlayout(location = 0) out mediump vec4 fragColor;\nvoid main (void)\n{\n\tfragColor = v_color;\n}\n"
             ,&local_18a);
  glu::FragmentSource::FragmentSource((FragmentSource *)local_120,&local_188);
  pPVar1 = glu::ProgramSources::operator<<(pPVar1,(ShaderSource *)local_120);
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,pPVar1);
  (this->super_BindingRenderCase).m_program = this_00;
  std::__cxx11::string::~string((string *)(local_120 + 8));
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)(local_148 + 8));
  std::__cxx11::string::~string((string *)&local_168);
  glu::ProgramSources::~ProgramSources(&local_f8);
  glu::operator<<(((this->super_BindingRenderCase).super_TestCase.super_TestCase.super_TestNode.
                  m_testCtx)->m_log,(this->super_BindingRenderCase).m_program);
  if ((((this->super_BindingRenderCase).m_program)->m_program).m_info.linkOk != false) {
    return;
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"could not build shader",(allocator<char> *)local_148);
  tcu::TestError::TestError(this_01,(string *)&local_f8);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void MixedApiCase::createShader (void)
{
	m_program = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::VertexSource(s_positionColorShader) << glu::FragmentSource(s_colorFragmentShader));
	m_testCtx.getLog() << *m_program;

	if (!m_program->isOk())
		throw tcu::TestError("could not build shader");
}